

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline.cpp
# Opt level: O1

void __thiscall
CMU462::Timeline::drawButton(Timeline *this,int element_type,double x,double y,double size)

{
  double x1;
  double cx;
  double dVar1;
  double dVar2;
  double x2;
  double y2;
  double x2_00;
  double y1;
  double cy;
  double x1_00;
  
  if (5 < (uint)element_type) {
    return;
  }
  dVar2 = size / 10.0;
  x1 = dVar2 + x;
  x2_00 = (x + size) - dVar2;
  y1 = dVar2 + y;
  y2 = (y + size) - dVar2;
  cx = (x1 + x2_00) * 0.5;
  cy = (y1 + y2) * 0.5;
  x2 = cx - dVar2 * 0.5;
  x1_00 = dVar2 * 0.5 + cx;
  dVar1 = y1;
  switch(element_type) {
  case 0:
    drawTriangle(this,x1,cy,x2,y1,x2,y2);
    dVar1 = cy;
    x1 = x2_00;
    break;
  case 1:
    goto LAB_001867b9;
  case 2:
    x1_00 = x1;
    y1 = cy;
    break;
  case 3:
    drawTriangle(this,x1,cy,x2,y1,x2,y2);
    x1 = x1_00;
LAB_001867b9:
    drawRectangle(this,x1,y1,x2_00,y2);
    return;
  case 4:
    drawRectangle(this,x1,y1,x2,y2);
    y1 = cy;
    x1 = x1_00;
    break;
  case 5:
    drawCircle(this,cx,cy,size * 0.5 - (dVar2 + dVar2),0x14);
    return;
  }
  drawTriangle(this,x1_00,dVar1,x2_00,y1,x1,y2);
  return;
}

Assistant:

void Timeline::drawButton(int element_type, double x, double y, double size)
  {

	double border_size = size/10.0;
	double x_left  = x + border_size;
	double x_right = x + size - border_size;
	double y_up    = y + border_size;
	double y_down  = y + size - border_size;

	double x_mid = (x_left + x_right) /2.0;
	double y_mid = (y_up + y_down)    /2.0;


	double x_mid_l = x_mid - border_size/2;
	double x_mid_r = x_mid + border_size/2;

	switch(element_type){

	case REWIND:

	  drawTriangle(x_left,  y_mid,
				   x_mid_l, y_up,
				   x_mid_l, y_down);

	  drawTriangle(x_mid_r, y_mid,
				   x_right, y_up,
				   x_right, y_down);

	  break;

	case STOP:

	  drawRectangle(x_left, y_up, x_right, y_down);

	  break;

	case PLAY:

	  drawTriangle(x_left,  y_up,
				   x_right, y_mid,
				   x_left,  y_down);
	  break;

	case STEP_BACK:

	  drawTriangle(x_left,  y_mid,
				   x_mid_l, y_up,
				   x_mid_l, y_down);

	  drawRectangle(x_mid_r, y_up, x_right, y_down);
	  break;

	case STEP_FORWARD:

	  drawRectangle(x_left, y_up, x_mid_l, y_down);

	  drawTriangle(x_mid_r, y_up,
				   x_right, y_mid,
				   x_mid_r, y_down);
	  break;

	case LOOP:

	  drawCircle(x_mid, y_mid, size/2 - border_size*2, 20);

	  /*
		STEP_BACK    = 3,
		STEP_FORWARD = 4,
		TIMELINE     = 5,
		LOOP         = 7,
		NONE         = 6
	  */

	}

  }